

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O1

mz_bool mz_zip_reader_end_internal(mz_zip_archive *pZip,mz_bool set_last_error)

{
  mz_zip_internal_state *pmVar1;
  int iVar2;
  mz_bool mVar3;
  mz_zip_internal_state *pState;
  
  mVar3 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar1 = pZip->m_pState;
    if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
        (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
      mVar3 = 0;
      if (set_last_error != 0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
    }
    else {
      pZip->m_pState = (mz_zip_internal_state *)0x0;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_central_dir).m_p);
      (pmVar1->m_central_dir).m_capacity = 0;
      *(undefined8 *)&(pmVar1->m_central_dir).m_element_size = 0;
      (pmVar1->m_central_dir).m_p = (void *)0x0;
      (pmVar1->m_central_dir).m_size = 0;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_central_dir_offsets).m_p);
      (pmVar1->m_central_dir_offsets).m_capacity = 0;
      *(undefined8 *)&(pmVar1->m_central_dir_offsets).m_element_size = 0;
      (pmVar1->m_central_dir_offsets).m_p = (void *)0x0;
      (pmVar1->m_central_dir_offsets).m_size = 0;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar1->m_sorted_central_dir_offsets).m_p);
      (pmVar1->m_sorted_central_dir_offsets).m_capacity = 0;
      *(undefined8 *)&(pmVar1->m_sorted_central_dir_offsets).m_element_size = 0;
      (pmVar1->m_sorted_central_dir_offsets).m_p = (void *)0x0;
      (pmVar1->m_sorted_central_dir_offsets).m_size = 0;
      mVar3 = 1;
      if ((FILE *)pmVar1->m_pFile != (FILE *)0x0) {
        if (pZip->m_zip_type == MZ_ZIP_TYPE_FILE) {
          iVar2 = fclose((FILE *)pmVar1->m_pFile);
          if (iVar2 == -1) {
            mVar3 = 0;
            if (set_last_error != 0) {
              pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
              mVar3 = 0;
            }
          }
        }
        pmVar1->m_pFile = (FILE *)0x0;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar1);
      pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
    }
  }
  return mVar3;
}

Assistant:

static mz_bool mz_zip_reader_end_internal(mz_zip_archive *pZip, mz_bool set_last_error)
{
    mz_bool status = MZ_TRUE;

    if (!pZip)
        return MZ_FALSE;

    if ((!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    {
        if (set_last_error)
            pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;

        return MZ_FALSE;
    }

    if (pZip->m_pState)
    {
        mz_zip_internal_state *pState = pZip->m_pState;
        pZip->m_pState = NULL;

        mz_zip_array_clear(pZip, &pState->m_central_dir);
        mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
        mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
        if (pState->m_pFile)
        {
            if (pZip->m_zip_type == MZ_ZIP_TYPE_FILE)
            {
                if (MZ_FCLOSE(pState->m_pFile) == EOF)
                {
                    if (set_last_error)
                        pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
                    status = MZ_FALSE;
                }
            }
            pState->m_pFile = NULL;
        }
#endif /* #ifndef MINIZ_NO_STDIO */

        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    }
    pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;

    return status;
}